

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O0

void Mio_LibraryMatchesStop(Mio_Library_t *pLib)

{
  Mio_Library_t *pLib_local;
  
  if (pLib->vTtMem != (Vec_Mem_t *)0x0) {
    Vec_WecFree(pLib->vTt2Match);
    Vec_MemHashFree(pLib->vTtMem);
    Vec_MemFree(pLib->vTtMem);
    if (pLib->pCells != (Mio_Cell2_t *)0x0) {
      free(pLib->pCells);
      pLib->pCells = (Mio_Cell2_t *)0x0;
    }
  }
  return;
}

Assistant:

void Mio_LibraryMatchesStop( Mio_Library_t * pLib )
{
    if ( !pLib->vTtMem )
        return;
    Vec_WecFree( pLib->vTt2Match );
    Vec_MemHashFree( pLib->vTtMem );
    Vec_MemFree( pLib->vTtMem );
    ABC_FREE( pLib->pCells );
}